

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsBody.cpp
# Opt level: O3

void __thiscall
chrono::ChLoadBodyBodyBushingGeneric::ChLoadBodyBodyBushingGeneric
          (ChLoadBodyBodyBushingGeneric *this,shared_ptr<chrono::ChBody> *mbodyA,
          shared_ptr<chrono::ChBody> *mbodyB,ChFrame<double> *abs_application,
          ChMatrixConstRef mstiffness,ChMatrixConstRef mdamping)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  double *pdVar2;
  long lVar3;
  double dVar4;
  PointerType ptr;
  undefined1 auVar5 [32];
  shared_ptr<chrono::ChBody> local_58;
  shared_ptr<chrono::ChBody> local_48;
  undefined1 local_38 [24];
  double local_20;
  
  local_48.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mbodyA->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_48.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (mbodyA->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  p_Var1 = (mbodyA->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  local_58.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mbodyB->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_58.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (mbodyB->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  p_Var1 = (mbodyB->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  ChLoadBodyBody::ChLoadBodyBody(&this->super_ChLoadBodyBody,&local_48,&local_58,abs_application);
  if (local_58.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_48.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  (this->super_ChLoadBodyBody).super_ChLoadCustomMultiple.super_ChLoadBase.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLoadBodyBodyBushingGeneric_00b215a0;
  if (((mstiffness->
       super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
       ).
       super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
       .m_rows.m_value == 6) &&
     ((mstiffness->
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value == 6)) {
    pdVar2 = (mstiffness->
             super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).
             super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_data;
    lVar3 = (mstiffness->
            super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            ).m_stride.m_outer.m_value;
    dVar4 = pdVar2[1];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0] = *pdVar2;
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[1] = dVar4;
    dVar4 = pdVar2[3];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[2] = pdVar2[2];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[3] = dVar4;
    dVar4 = pdVar2[5];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[4] = pdVar2[4];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[5] = dVar4;
    dVar4 = (pdVar2 + lVar3)[1];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[6] = pdVar2[lVar3];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[7] = dVar4;
    dVar4 = (pdVar2 + lVar3 + 2)[1];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[8] = pdVar2[lVar3 + 2];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[9] = dVar4;
    dVar4 = (pdVar2 + lVar3 + 4)[1];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[10] = pdVar2[lVar3 + 4];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0xb] = dVar4;
    dVar4 = (pdVar2 + lVar3 * 2)[1];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0xc] = pdVar2[lVar3 * 2];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0xd] = dVar4;
    dVar4 = (pdVar2 + lVar3 * 2 + 2)[1];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0xe] = pdVar2[lVar3 * 2 + 2];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0xf] = dVar4;
    dVar4 = (pdVar2 + lVar3 * 2 + 4)[1];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x10] = pdVar2[lVar3 * 2 + 4];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x11] = dVar4;
    dVar4 = (pdVar2 + lVar3 * 3)[1];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x12] = pdVar2[lVar3 * 3];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x13] = dVar4;
    dVar4 = (pdVar2 + lVar3 * 3 + 2)[1];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x14] = pdVar2[lVar3 * 3 + 2];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x15] = dVar4;
    dVar4 = (pdVar2 + lVar3 * 3 + 4)[1];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x16] = pdVar2[lVar3 * 3 + 4];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x17] = dVar4;
    dVar4 = (pdVar2 + lVar3 * 4)[1];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x18] = pdVar2[lVar3 * 4];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x19] = dVar4;
    dVar4 = (pdVar2 + lVar3 * 4 + 2)[1];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x1a] = pdVar2[lVar3 * 4 + 2];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x1b] = dVar4;
    dVar4 = (pdVar2 + lVar3 * 4 + 4)[1];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x1c] = pdVar2[lVar3 * 4 + 4];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x1d] = dVar4;
    dVar4 = (pdVar2 + lVar3 * 5)[1];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x1e] = pdVar2[lVar3 * 5];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x1f] = dVar4;
    dVar4 = (pdVar2 + lVar3 * 5 + 2)[1];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x20] = pdVar2[lVar3 * 5 + 2];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x21] = dVar4;
    dVar4 = (pdVar2 + lVar3 * 5 + 4)[1];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x22] = pdVar2[lVar3 * 5 + 4];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x23] = dVar4;
    if (((mdamping->
         super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
         ).
         super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
         .m_rows.m_value == 6) &&
       ((mdamping->
        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        ).
        super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_cols.m_value == 6)) {
      pdVar2 = (mdamping->
               super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               ).
               super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
               .m_data;
      lVar3 = (mdamping->
              super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              ).m_stride.m_outer.m_value;
      dVar4 = pdVar2[1];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0] = *pdVar2;
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[1] = dVar4;
      dVar4 = pdVar2[3];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[2] = pdVar2[2];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[3] = dVar4;
      dVar4 = pdVar2[5];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[4] = pdVar2[4];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[5] = dVar4;
      dVar4 = (pdVar2 + lVar3)[1];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[6] = pdVar2[lVar3];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[7] = dVar4;
      dVar4 = (pdVar2 + lVar3 + 2)[1];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[8] = pdVar2[lVar3 + 2];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[9] = dVar4;
      dVar4 = (pdVar2 + lVar3 + 4)[1];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[10] = pdVar2[lVar3 + 4];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0xb] = dVar4;
      dVar4 = (pdVar2 + lVar3 * 2)[1];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0xc] = pdVar2[lVar3 * 2];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0xd] = dVar4;
      dVar4 = (pdVar2 + lVar3 * 2 + 2)[1];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0xe] = pdVar2[lVar3 * 2 + 2];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0xf] = dVar4;
      dVar4 = (pdVar2 + lVar3 * 2 + 4)[1];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0x10] = pdVar2[lVar3 * 2 + 4];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0x11] = dVar4;
      dVar4 = (pdVar2 + lVar3 * 3)[1];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0x12] = pdVar2[lVar3 * 3];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0x13] = dVar4;
      dVar4 = (pdVar2 + lVar3 * 3 + 2)[1];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0x14] = pdVar2[lVar3 * 3 + 2];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0x15] = dVar4;
      dVar4 = (pdVar2 + lVar3 * 3 + 4)[1];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0x16] = pdVar2[lVar3 * 3 + 4];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0x17] = dVar4;
      dVar4 = (pdVar2 + lVar3 * 4)[1];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0x18] = pdVar2[lVar3 * 4];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0x19] = dVar4;
      dVar4 = (pdVar2 + lVar3 * 4 + 2)[1];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0x1a] = pdVar2[lVar3 * 4 + 2];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0x1b] = dVar4;
      dVar4 = (pdVar2 + lVar3 * 4 + 4)[1];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0x1c] = pdVar2[lVar3 * 4 + 4];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0x1d] = dVar4;
      dVar4 = (pdVar2 + lVar3 * 5)[1];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0x1e] = pdVar2[lVar3 * 5];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0x1f] = dVar4;
      dVar4 = (pdVar2 + lVar3 * 5 + 2)[1];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0x20] = pdVar2[lVar3 * 5 + 2];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0x21] = dVar4;
      dVar4 = (pdVar2 + lVar3 * 5 + 4)[1];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0x22] = pdVar2[lVar3 * 5 + 4];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0x23] = dVar4;
      auVar5 = ZEXT832(0) << 0x20;
      this->neutral_force = (ChVector<double>)auVar5._0_24_;
      (this->neutral_torque).m_data[0] = (double)auVar5._24_8_;
      *(undefined1 (*) [32])((this->neutral_force).m_data + 2) = auVar5;
      local_38._8_16_ = ZEXT816(0) << 0x20;
      local_38._0_8_ = 1.0;
      local_20 = 0.0;
      (this->neutral_displacement)._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b03780;
      *(undefined1 (*) [16])(this->neutral_displacement).coord.pos.m_data = local_38._8_16_;
      (this->neutral_displacement).coord.pos.m_data[2] = 0.0;
      (this->neutral_displacement).coord.rot.m_data[0] = 1.0;
      *(undefined1 (*) [16])((this->neutral_displacement).coord.rot.m_data + 1) = local_38._8_16_;
      (this->neutral_displacement).coord.rot.m_data[3] = 0.0;
      ChMatrix33<double>::ChMatrix33
                (&(this->neutral_displacement).Amatrix,(ChQuaternion<double> *)local_38);
      return;
    }
  }
  __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                "void Eigen::PlainObjectBase<Eigen::Matrix<double, 6, 6, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 6, 6, 1>]"
               );
}

Assistant:

ChLoadBodyBodyBushingGeneric::ChLoadBodyBodyBushingGeneric(std::shared_ptr<ChBody> mbodyA,
                                                           std::shared_ptr<ChBody> mbodyB,
                                                           const ChFrame<>& abs_application,
                                                           ChMatrixConstRef mstiffness,
                                                           ChMatrixConstRef mdamping)
    : ChLoadBodyBody(mbodyA, mbodyB, abs_application), stiffness(mstiffness), damping(mdamping) {}